

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqllogic_command.cpp
# Opt level: O1

void __thiscall duckdb::LoadCommand::ExecuteInternal(LoadCommand *this,ExecuteContext *context)

{
  SQLLogicTestRunner *pSVar1;
  pointer pcVar2;
  pointer pDVar3;
  pointer this_00;
  DatabaseInstance *pDVar4;
  DBConfig DVar5;
  unique_ptr<duckdb::DBConfig,_std::default_delete<duckdb::DBConfig>,_true> *this_01;
  string resolved_path;
  string local_a8;
  undefined1 *local_88 [2];
  undefined1 local_78 [16];
  string local_68;
  string local_48;
  
  pSVar1 = (this->super_Command).runner;
  pcVar2 = (this->dbpath)._M_dataplus._M_p;
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_48,pcVar2,pcVar2 + (this->dbpath)._M_string_length);
  SQLLogicTestRunner::LoopReplacement(&local_a8,pSVar1,&local_48,&context->running_loops);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  if (this->readonly == false) {
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_68,local_a8._M_dataplus._M_p,
               local_a8._M_dataplus._M_p + local_a8._M_string_length);
    DeleteDatabase(&local_68);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p);
    }
  }
  std::__cxx11::string::_M_assign((string *)&((this->super_Command).runner)->dbpath);
  this_01 = &((this->super_Command).runner)->config;
  if (this->readonly == true) {
    pDVar3 = unique_ptr<duckdb::DBConfig,_std::default_delete<duckdb::DBConfig>,_true>::operator->
                       (this_01);
    pDVar3[0x148] = (DBConfig)0x0;
    pDVar3 = unique_ptr<duckdb::DBConfig,_std::default_delete<duckdb::DBConfig>,_true>::operator->
                       (&((this->super_Command).runner)->config);
    DVar5 = (DBConfig)0x2;
  }
  else {
    pDVar3 = unique_ptr<duckdb::DBConfig,_std::default_delete<duckdb::DBConfig>,_true>::operator->
                       (this_01);
    pDVar3[0x148] = (DBConfig)0x1;
    pDVar3 = unique_ptr<duckdb::DBConfig,_std::default_delete<duckdb::DBConfig>,_true>::operator->
                       (&((this->super_Command).runner)->config);
    DVar5 = (DBConfig)0x1;
  }
  pDVar3[0xd0] = DVar5;
  pSVar1 = (this->super_Command).runner;
  if ((pSVar1->db).super_unique_ptr<duckdb::DuckDB,_std::default_delete<duckdb::DuckDB>_>._M_t.
      super___uniq_ptr_impl<duckdb::DuckDB,_std::default_delete<duckdb::DuckDB>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::DuckDB_*,_std::default_delete<duckdb::DuckDB>_>.
      super__Head_base<0UL,_duckdb::DuckDB_*,_false>._M_head_impl != (DuckDB *)0x0) {
    this_00 = unique_ptr<duckdb::DuckDB,_std::default_delete<duckdb::DuckDB>,_true>::operator->
                        (&pSVar1->db);
    pDVar4 = shared_ptr<duckdb::DatabaseInstance,_true>::operator->
                       ((shared_ptr<duckdb::DatabaseInstance,_true> *)this_00);
    pDVar3 = unique_ptr<duckdb::DBConfig,_std::default_delete<duckdb::DBConfig>,_true>::operator->
                       (&((this->super_Command).runner)->config);
    std::__cxx11::string::_M_assign((string *)(pDVar3 + 0x208));
    *(DatabaseInstance *)(pDVar3 + 0x230) = pDVar4[0x240];
    *(undefined8 *)(pDVar3 + 0x228) = *(undefined8 *)(pDVar4 + 0x238);
  }
  pSVar1 = (this->super_Command).runner;
  local_88[0] = local_78;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_88,local_a8._M_dataplus._M_p,
             local_a8._M_dataplus._M_p + local_a8._M_string_length);
  (**pSVar1->_vptr_SQLLogicTestRunner)(pSVar1,local_88,1);
  if (local_88[0] != local_78) {
    operator_delete(local_88[0]);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p);
  }
  return;
}

Assistant:

void LoadCommand::ExecuteInternal(ExecuteContext &context) const {
	auto resolved_path = runner.LoopReplacement(dbpath, context.running_loops);
	if (!readonly) {
		// delete the target database file, if it exists
		DeleteDatabase(resolved_path);
	}
	runner.dbpath = resolved_path;

	// set up the config file
	if (readonly) {
		runner.config->options.use_temporary_directory = false;
		runner.config->options.access_mode = AccessMode::READ_ONLY;
	} else {
		runner.config->options.use_temporary_directory = true;
		runner.config->options.access_mode = AccessMode::AUTOMATIC;
	}
	if (runner.db) {
		runner.config->options.serialization_compatibility =
		    runner.db->instance->config.options.serialization_compatibility;
	}
	// now create the database file
	runner.LoadDatabase(resolved_path, true);
}